

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O2

string * __thiscall
absl::lts_20250127::time_internal::cctz::TimeZoneInfo::Description_abi_cxx11_
          (string *__return_storage_ptr__,TimeZoneInfo *this)

{
  ostream *poVar1;
  ostringstream oss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar1 = std::operator<<((ostream *)&oss,"#trans=");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<((ostream *)&oss," #types=");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<((ostream *)&oss," spec=\'");
  poVar1 = std::operator<<(poVar1,(string *)&this->future_spec_);
  std::operator<<(poVar1,"\'");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  return __return_storage_ptr__;
}

Assistant:

std::string TimeZoneInfo::Description() const {
  std::ostringstream oss;
  oss << "#trans=" << transitions_.size();
  oss << " #types=" << transition_types_.size();
  oss << " spec='" << future_spec_ << "'";
  return oss.str();
}